

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

void adjust_level(player *p,_Bool verbose)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  bool bVar3;
  ushort uVar4;
  short sVar5;
  int *piVar6;
  source sVar7;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  char buf [80];
  
  if (p->exp < 0) {
    p->exp = 0;
  }
  if (p->max_exp < 0) {
    p->max_exp = 0;
  }
  if (99999999 < p->exp) {
    p->exp = 99999999;
  }
  if (99999999 < p->max_exp) {
    p->max_exp = 99999999;
  }
  if (p->max_exp < p->exp) {
    p->max_exp = p->exp;
  }
  puVar1 = &p->upkeep->redraw;
  *puVar1 = *puVar1 | 8;
  handle_stuff(p);
  if (1 < p->lev) {
    uVar4 = p->lev;
    do {
      if (player_exp[uVar4 - 2] <= p->exp) break;
      p->lev = uVar4 - 1;
      bVar3 = 2 < (short)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  sVar5 = p->lev;
  while ((sVar5 < 0x32 && (*(int *)(&DAT_002386dc + (long)sVar5 * 4) <= p->exp))) {
    sVar5 = sVar5 + 1;
    p->lev = sVar5;
    if (p->max_lev < sVar5) {
      p->max_lev = sVar5;
    }
    strnfmt(buf,0x50,"Reached level %d",(ulong)(uint)(int)sVar5);
    history_add(p,buf,L'\t');
    msgt(7,"Welcome to level %d.",(ulong)(uint)(int)p->lev);
    sVar7 = source_none();
    origin.which = sVar7.which;
    origin._4_4_ = 0;
    origin.what = sVar7.what;
    effect_simple(L'\x10',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar7 = source_none();
    origin_00.which = sVar7.which;
    origin_00._4_4_ = 0;
    origin_00.what = sVar7.what;
    effect_simple(L'\x10',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar7 = source_none();
    origin_01.which = sVar7.which;
    origin_01._4_4_ = 0;
    origin_01.what = sVar7.what;
    effect_simple(L'\x10',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar7 = source_none();
    origin_02.which = sVar7.which;
    origin_02._4_4_ = 0;
    origin_02.what = sVar7.what;
    effect_simple(L'\x10',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar7 = source_none();
    origin_03.which = sVar7.which;
    origin_03._4_4_ = 0;
    origin_03.what = sVar7.what;
    effect_simple(L'\x10',origin_03,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar5 = p->lev;
  }
  sVar5 = p->max_lev;
  if ((long)sVar5 < 0x32) {
    piVar6 = (int *)(&DAT_002386dc + (long)sVar5 * 4);
    sVar5 = sVar5 + 1;
    do {
      if (p->max_exp < *piVar6) break;
      p->max_lev = sVar5;
      piVar6 = piVar6 + 1;
      sVar5 = sVar5 + 1;
    } while (sVar5 != 0x33);
  }
  ppVar2 = p->upkeep;
  puVar1 = &ppVar2->update;
  *puVar1 = *puVar1 | 0x15;
  puVar1 = &ppVar2->redraw;
  *(byte *)puVar1 = (byte)*puVar1 | 0x1e;
  handle_stuff(p);
  return;
}

Assistant:

static void adjust_level(struct player *p, bool verbose)
{
	if (p->exp < 0)
		p->exp = 0;

	if (p->max_exp < 0)
		p->max_exp = 0;

	if (p->exp > PY_MAX_EXP)
		p->exp = PY_MAX_EXP;

	if (p->max_exp > PY_MAX_EXP)
		p->max_exp = PY_MAX_EXP;

	if (p->exp > p->max_exp)
		p->max_exp = p->exp;

	p->upkeep->redraw |= PR_EXP;

	handle_stuff(p);

	while ((p->lev > 1) && (p->exp < player_exp[p->lev - 2])) {
		p->lev--;
	}

	while ((p->lev < PY_MAX_LEVEL) && (p->exp >= player_exp[p->lev - 1])) {
		char buf[80];

		p->lev++;

		/* Save the highest level */
		if (p->lev > p->max_lev)
			p->max_lev = p->lev;

		if (verbose) {
			/* Log level updates */
			strnfmt(buf, sizeof(buf), "Reached level %d", p->lev);
			history_add(p, buf, HIST_GAIN_LEVEL);

			/* Message */
			msgt(MSG_LEVEL, "Welcome to level %d.",	p->lev);
		}

		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_STR,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_INT,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_WIS,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_DEX,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_CON,
					  0, 0, 0, 0, NULL);
	}

	while ((p->max_lev < PY_MAX_LEVEL) &&
		   (p->max_exp >= player_exp[p->max_lev - 1])) {
		p->max_lev++;
	}

	p->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);
	p->upkeep->redraw |= (PR_LEV | PR_TITLE | PR_EXP | PR_STATS);
	handle_stuff(p);
}